

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

bool __thiscall
argstest::ArgumentParser::
Complete<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ArgumentParser *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          it,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             end)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  undefined8 uVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  undefined4 extraout_var_01;
  long *plVar6;
  string *psVar7;
  iterator __begin6;
  undefined1 choice [8];
  Matcher *this_00;
  EitherFlag *this_01;
  bool bVar8;
  iterator __begin4;
  long *plVar9;
  pointer pbVar10;
  bool bVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  choices;
  __string_type __str;
  vector<argstest::FlagBase_*,_std::allocator<argstest::FlagBase_*>_> flags;
  vector<argstest::Command_*,_std::allocator<argstest::Command_*>_> commands;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  undefined1 local_f0 [8];
  string sStack_e8;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  string *local_88;
  long *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  long *local_60;
  long *local_58;
  long *local_48;
  long *local_40;
  
  bVar8 = (bool)(it._M_current + 1 == end._M_current & this->readCompletion);
  if (bVar8 != true) {
    return bVar8;
  }
  iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[8])();
  plVar6 = (long *)CONCAT44(extraout_var,iVar4);
  (*(this->super_Command).super_Group.super_Base._vptr_Base[5])(&local_48,this);
  sStack_e8.field_2._M_allocated_capacity._4_4_ = ParseOption(this,it._M_current,true);
  if (local_48 == local_40) {
LAB_001b8afc:
    if ((plVar6 != (long *)0x0) && ((*(byte *)(plVar6 + 1) & 0x40) == 0)) {
      if ((char)plVar6[0x18] == '\x01') {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_100,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(plVar6 + 0x15));
      }
      else {
        (**(code **)(*plVar6 + 0x90))(local_100,plVar6,&this->helpParams);
      }
      _Var2._M_p = local_f8._M_p;
      bVar8 = local_100 == (undefined1  [8])local_f8._M_p;
      bVar11 = sStack_e8.field_2._M_allocated_capacity._4_4_ == Positional;
      for (choice = local_100; choice != (undefined1  [8])_Var2._M_p;
          choice = (undefined1  [8])((long)choice + 0x20)) {
        AddCompletionReply(this,it._M_current,(string *)choice);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_100);
      if (bVar11 && bVar8) goto LAB_001b910c;
    }
  }
  else {
    plVar9 = local_48;
    if ((sStack_e8.field_2._M_allocated_capacity._4_4_ == Positional) ||
       ((it._M_current)->_M_string_length == 0)) {
      for (; plVar9 != local_40; plVar9 = plVar9 + 1) {
        if ((*(byte *)(*plVar9 + 8) & 0x40) == 0) {
          AddCompletionReply(this,it._M_current,(string *)(*plVar9 + 0x90));
        }
      }
      goto LAB_001b910c;
    }
    if (local_48 == local_40) goto LAB_001b8afc;
    do {
      if ((*(byte *)(*plVar9 + 8) & 0x40) == 0) {
        AddCompletionReply(this,it._M_current,(string *)(*plVar9 + 0x90));
      }
      plVar9 = plVar9 + 1;
    } while (plVar9 != local_40);
  }
  sStack_e8.field_2._8_8_ = it._M_current;
  (*(this->super_Command).super_Group.super_Base._vptr_Base[9])(&local_60);
  local_80 = local_58;
  if (local_60 != local_58) {
    local_88 = &this->shortprefix;
    plVar6 = local_60;
    do {
      if ((*(byte *)(*plVar6 + 8) & 0x40) == 0) {
        this_00 = (Matcher *)(*plVar6 + 200);
        Matcher::GetShortOrAny((EitherFlag *)local_100,this_00);
        EitherFlag::str((string *)local_c8,(EitherFlag *)local_100,local_88,&this->longprefix);
        bVar8 = AddCompletionReply(this,(string *)sStack_e8.field_2._8_8_,(string *)local_c8);
        if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
        if ((string *)local_f8._M_p != &sStack_e8) {
          operator_delete(local_f8._M_p);
        }
        if (!bVar8) {
          Matcher::GetFlagStrings
                    ((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_> *)local_c8
                     ,this_00);
          uVar3 = local_c8._8_8_;
          this_01 = (EitherFlag *)local_c8._0_8_;
          if (local_c8._0_8_ != local_c8._8_8_) {
            do {
              EitherFlag::str((string *)local_100,this_01,local_88,&this->longprefix);
              bVar8 = AddCompletionReply(this,(string *)sStack_e8.field_2._8_8_,(string *)local_100)
              ;
              if (local_100 != (undefined1  [8])local_f0) {
                operator_delete((void *)local_100);
              }
              this_01 = this_01 + 1;
            } while (!bVar8 && this_01 != (EitherFlag *)uVar3);
          }
          std::vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_>::~vector
                    ((vector<argstest::EitherFlag,_std::allocator<argstest::EitherFlag>_> *)local_c8
                    );
        }
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != local_80);
  }
  uVar3 = sStack_e8.field_2._8_8_;
  if (sStack_e8.field_2._M_allocated_capacity._4_4_ == LongFlag) {
    if (this->allowJoinedLongValue == true) {
      if ((this->longseparator)._M_string_length == 0) {
        uVar5 = 0xffffffffffffffff;
      }
      else {
        uVar5 = std::__cxx11::string::find
                          ((char *)sStack_e8.field_2._8_8_,
                           (ulong)(this->longseparator)._M_dataplus._M_p,0);
      }
      if (uVar5 != 0xffffffffffffffff) {
        std::__cxx11::string::string((string *)local_c8,(string *)uVar3,0,uVar5);
        std::__cxx11::string::substr((ulong)local_a8,(ulong)local_c8);
        local_100 = (undefined1  [8])((ulong)local_100 & 0xffffffffffff0000);
        local_f8._M_p = (pointer)&sStack_e8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_a8._0_8_,(pointer)(local_a8._0_8_ + local_a8._8_8_));
        iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_100);
        plVar6 = (long *)CONCAT44(extraout_var_01,iVar4);
        if ((string *)local_f8._M_p != &sStack_e8) {
          operator_delete(local_f8._M_p);
        }
        if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
          operator_delete((void *)local_a8._0_8_);
        }
        if (plVar6 != (long *)0x0) {
          if ((char)plVar6[0x18] == '\x01') {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector(&local_78,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(plVar6 + 0x15));
          }
          else {
            (**(code **)(*plVar6 + 0x90))(&local_78,plVar6,&this->helpParams);
          }
          if (local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_78.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            pbVar10 = local_78.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_c8,&this->longseparator);
              plVar6 = (long *)std::__cxx11::string::_M_append
                                         ((char *)local_a8,(ulong)(pbVar10->_M_dataplus)._M_p);
              psVar7 = (string *)(plVar6 + 2);
              if ((string *)*plVar6 == psVar7) {
                local_f0 = (undefined1  [8])(psVar7->_M_dataplus)._M_p;
                sStack_e8._M_dataplus._M_p = (pointer)plVar6[3];
                local_100 = (undefined1  [8])local_f0;
              }
              else {
                local_f0 = (undefined1  [8])(psVar7->_M_dataplus)._M_p;
                local_100 = (undefined1  [8])*plVar6;
              }
              local_f8._M_p = (pointer)plVar6[1];
              *plVar6 = (long)psVar7;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              AddCompletionReply(this,(string *)sStack_e8.field_2._8_8_,(string *)local_100);
              if (local_100 != (undefined1  [8])local_f0) {
                operator_delete((void *)local_100);
              }
              if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
                operator_delete((void *)local_a8._0_8_);
              }
              pbVar10 = pbVar10 + 1;
            } while (pbVar10 !=
                     local_78.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_78);
        }
        if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_);
        }
      }
    }
  }
  else if ((sStack_e8.field_2._M_allocated_capacity._4_4_ == ShortFlag) &&
          (this->allowJoinedShortValue == true)) {
    uVar5 = (this->shortprefix)._M_string_length;
    if (uVar5 + 1 < *(size_type *)(sStack_e8.field_2._8_8_ + 8)) {
      if (*(size_type *)(sStack_e8.field_2._8_8_ + 8) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
      }
      local_100[1] = *(char *)(*(long *)sStack_e8.field_2._8_8_ + uVar5);
      local_100[0] = true;
      local_f0 = (undefined1  [8])0x0;
      sStack_e8._M_dataplus._M_p = sStack_e8._M_dataplus._M_p & 0xffffffffffffff00;
      local_f8._M_p = (pointer)&sStack_e8;
      iVar4 = (*(this->super_Command).super_Group.super_Base._vptr_Base[7])(this,local_100);
      plVar6 = (long *)CONCAT44(extraout_var_00,iVar4);
      if ((string *)local_f8._M_p != &sStack_e8) {
        operator_delete(local_f8._M_p);
      }
      if (plVar6 != (long *)0x0) {
        if ((char)plVar6[0x18] == '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(plVar6 + 0x15));
        }
        else {
          (**(code **)(*plVar6 + 0x90))(local_a8,plVar6,&this->helpParams);
        }
        if (local_a8._0_8_ != local_a8._8_8_) {
          pbVar10 = (pointer)local_a8._0_8_;
          do {
            pcVar1 = (this->shortprefix)._M_dataplus._M_p;
            local_c8._0_8_ = (EitherFlag *)(local_c8 + 0x10);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_c8,pcVar1,pcVar1 + (this->shortprefix)._M_string_length);
            std::__cxx11::string::_M_replace_aux((ulong)local_c8,local_c8._8_8_,0,'\x01');
            plVar6 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_c8,(ulong)(pbVar10->_M_dataplus)._M_p);
            psVar7 = (string *)(plVar6 + 2);
            if ((string *)*plVar6 == psVar7) {
              local_f0 = (undefined1  [8])(psVar7->_M_dataplus)._M_p;
              sStack_e8._M_dataplus._M_p = (pointer)plVar6[3];
              local_100 = (undefined1  [8])local_f0;
            }
            else {
              local_f0 = (undefined1  [8])(psVar7->_M_dataplus)._M_p;
              local_100 = (undefined1  [8])*plVar6;
            }
            local_f8._M_p = (pointer)plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            AddCompletionReply(this,(string *)sStack_e8.field_2._8_8_,(string *)local_100);
            if (local_100 != (undefined1  [8])local_f0) {
              operator_delete((void *)local_100);
            }
            if ((EitherFlag *)local_c8._0_8_ != (EitherFlag *)(local_c8 + 0x10)) {
              operator_delete((void *)local_c8._0_8_);
            }
            pbVar10 = pbVar10 + 1;
          } while (pbVar10 != (pointer)local_a8._8_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_a8);
      }
    }
  }
  if (local_60 != (long *)0x0) {
    operator_delete(local_60);
  }
LAB_001b910c:
  if (local_48 != (long *)0x0) {
    operator_delete(local_48);
  }
  return true;
}

Assistant:

bool Complete(It it, It end)
            {
                auto nextIt = it;
                if (!readCompletion || (++nextIt != end))
                {
                    return false;
                }

                const auto &chunk = *it;
                auto pos = GetNextPositional();
                std::vector<Command *> commands = GetCommands();
                const auto optionType = ParseOption(chunk, true);

                if (!commands.empty() && (chunk.empty() || optionType == OptionType::Positional))
                {
                    for (auto &cmd : commands)
                    {
                        if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            AddCompletionReply(chunk, cmd->Name());
                        }
                    }
                } else
                {
                    bool hasPositionalCompletion = true;

                    if (!commands.empty())
                    {
                        for (auto &cmd : commands)
                        {
                            if ((cmd->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                            {
                                AddCompletionReply(chunk, cmd->Name());
                            }
                        }
                    } else if (pos)
                    {
                        if ((pos->GetOptions() & Options::HiddenFromCompletion) == Options::None)
                        {
                            auto choices = pos->HelpChoices(helpParams);
                            hasPositionalCompletion = !choices.empty() || optionType != OptionType::Positional;
                            for (auto &choice : choices)
                            {
                                AddCompletionReply(chunk, choice);
                            }
                        }
                    }

                    if (hasPositionalCompletion)
                    {
                        auto flags = GetAllFlags();
                        for (auto flag : flags)
                        {
                            if ((flag->GetOptions() & Options::HiddenFromCompletion) != Options::None)
                            {
                                continue;
                            }

                            auto &matcher = flag->GetMatcher();
                            if (!AddCompletionReply(chunk, matcher.GetShortOrAny().str(shortprefix, longprefix)))
                            {
                                for (auto &flagName : matcher.GetFlagStrings())
                                {
                                    if (AddCompletionReply(chunk, flagName.str(shortprefix, longprefix)))
                                    {
                                        break;
                                    }
                                }
                            }
                        }

                        if (optionType == OptionType::LongFlag && allowJoinedLongValue)
                        {
                            const auto separator = longseparator.empty() ? chunk.npos : chunk.find(longseparator);
                            if (separator != chunk.npos)
                            {
                                std::string arg(chunk, 0, separator);
                                if (auto flag = this->Match(arg.substr(longprefix.size())))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, arg + longseparator + choice);
                                    }
                                }
                            }
                        } else if (optionType == OptionType::ShortFlag && allowJoinedShortValue)
                        {
                            if (chunk.size() > shortprefix.size() + 1)
                            {
                                auto arg = chunk.at(shortprefix.size());
                                //TODO: support -abcVALUE where a and b take no value
                                if (auto flag = this->Match(arg))
                                {
                                    for (auto &choice : flag->HelpChoices(helpParams))
                                    {
                                        AddCompletionReply(chunk, shortprefix + arg + choice);
                                    }
                                }
                            }
                        }
                    }
                }

#ifndef ARGS_NOEXCEPT
                throw Completion(completion->Get());
#else
                return true;
#endif
            }